

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPT.cpp
# Opt level: O2

Index __thiscall CPT::Sample(CPT *this,Index y)

{
  int iVar1;
  uint uVar2;
  double dVar3;
  
  iVar1 = rand();
  dVar3 = 0.0;
  uVar2 = 0;
  while( true ) {
    if (((this->_m_probTable).size1_ <= (ulong)uVar2) ||
       (dVar3 = dVar3 + (this->_m_probTable).data_.data_
                        [(ulong)y + (this->_m_probTable).size2_ * (ulong)uVar2],
       (double)iVar1 * 4.656612873077393e-10 <= dVar3)) break;
    uVar2 = uVar2 + 1;
  }
  return uVar2;
}

Assistant:

Index CPT::Sample(Index y) const
{
    double randNr=rand() / (RAND_MAX + 1.0);
    double cumprob = 0.0;
    Index x;
    for(x=0; x < nrX(); x++)
    {
        cumprob += _m_probTable(x,y);
        if(randNr<=cumprob)
            break;
    }
    return(x);    
}